

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.h
# Opt level: O0

void __thiscall
HeapMap<int,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>::
Trace(HeapMap<int,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
      *this,Visitor *visitor)

{
  bool bVar1;
  reference pvVar2;
  value_type *pr;
  const_iterator __end0;
  const_iterator __begin0;
  Container *__range2;
  Visitor *visitor_local;
  HeapMap<int,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *this_local;
  
  __end0 = std::
           unordered_map<int,_Member<LinkedNode>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Member<LinkedNode>_*>_>_>
           ::begin(&this->map_);
  pr = (value_type *)
       std::
       unordered_map<int,_Member<LinkedNode>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Member<LinkedNode>_*>_>_>
       ::end(&this->map_);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end0.
                        super__Node_iterator_base<std::pair<const_int,_Member<LinkedNode>_*>,_false>
                       ,(_Node_iterator_base<std::pair<const_int,_Member<LinkedNode>_*>,_false> *)
                        &pr);
    if (!bVar1) break;
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_int,_Member<LinkedNode>_*>,_false,_false>::
             operator*(&__end0);
    Visitor::Trace<LinkedNode>(visitor,pvVar2->second);
    std::__detail::_Node_const_iterator<std::pair<const_int,_Member<LinkedNode>_*>,_false,_false>::
    operator++(&__end0);
  }
  return;
}

Assistant:

void Trace(Visitor *visitor) const override {
    for (auto &pr : map_) {
      visitor->Trace(*pr.second);
    }
  }